

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O3

void __thiscall wasm_trap_t::wasm_trap_t(wasm_trap_t *this,RefPtr<wabt::interp::Trap> *ptr)

{
  Trap *pTVar1;
  Store *this_00;
  Index index;
  Index IVar2;
  
  pTVar1 = ptr->obj_;
  this_00 = ptr->store_;
  if (this_00 == (Store *)0x0) {
    (this->super_wasm_ref_t).I.obj_ = &pTVar1->super_Object;
    (this->super_wasm_ref_t).I.store_ = (Store *)0x0;
    index = 0;
    IVar2 = 0;
  }
  else {
    index = wabt::interp::Store::CopyRoot(this_00,ptr->root_index_);
    (this->super_wasm_ref_t).I.obj_ = &pTVar1->super_Object;
    (this->super_wasm_ref_t).I.store_ = this_00;
    IVar2 = wabt::interp::Store::CopyRoot(this_00,index);
  }
  (this->super_wasm_ref_t).I.root_index_ = IVar2;
  if (pTVar1 != (Trap *)0x0) {
    wabt::interp::Store::DeleteRoot(this_00,index);
    return;
  }
  return;
}

Assistant:

wasm_trap_t(RefPtr<Trap> ptr) : wasm_ref_t(ptr) {}